

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ast.c
# Opt level: O1

void delete_ast_for_statement(AST_For_Statement *for_statement)

{
  if (for_statement->condition != (AST *)0x0) {
    delete_ast(for_statement->condition);
  }
  if (for_statement->initialisation != (AST *)0x0) {
    delete_ast(for_statement->initialisation);
  }
  if (for_statement->update != (AST *)0x0) {
    delete_ast(for_statement->update);
  }
  if (for_statement->body_statement != (AST *)0x0) {
    delete_ast(for_statement->body_statement);
  }
  free(for_statement);
  return;
}

Assistant:

void delete_ast_for_statement(struct AST_For_Statement *for_statement)
{
	if(for_statement->condition!=NULL)
		delete_ast(for_statement->condition);
	if(for_statement->initialisation!=NULL)
		delete_ast(for_statement->initialisation);
	if(for_statement->update!=NULL)
		delete_ast(for_statement->update);
	if(for_statement->body_statement!=NULL)
		delete_ast(for_statement->body_statement);
	free(for_statement);
}